

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onb.h
# Opt level: O0

vec3 * random_cosine_direction(void)

{
  vec3 *in_RDI;
  double dVar1;
  double dVar2;
  double e2;
  double dVar3;
  double dVar4;
  double y;
  double x;
  double phi;
  double z;
  double r2;
  double r1;
  
  dVar1 = random_double();
  dVar2 = random_double();
  e2 = sqrt(1.0 - dVar2);
  dVar3 = cos(dVar1 * 6.283185307179586);
  dVar4 = sqrt(dVar2);
  dVar1 = sin(dVar1 * 6.283185307179586);
  dVar2 = sqrt(dVar2);
  vec3::vec3(in_RDI,dVar3 * dVar4,dVar1 * dVar2,e2);
  return in_RDI;
}

Assistant:

inline vec3 random_cosine_direction() {
    auto r1 = random_double();
    auto r2 = random_double();
    auto z = sqrt(1 - r2);

    auto phi = 2 * pi * r1;
    auto x = cos(phi) * sqrt(r2);
    auto y = sin(phi) * sqrt(r2);

    return vec3(x, y, z);
}